

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutazioneI.cpp
# Opt level: O1

void __thiscall PermutazioneI::inserisci(PermutazioneI *this,PermutazioneI *p,Coppia *c)

{
  unsigned_short uVar1;
  int iVar2;
  int iVar3;
  unsigned_short *__src;
  unsigned_short *puVar4;
  
  puVar4 = (p->super_Permutazione).individuo;
  iVar2 = c->x;
  uVar1 = puVar4[iVar2];
  iVar3 = c->y;
  if (iVar2 < iVar3) {
    puVar4 = puVar4 + iVar2;
    __src = puVar4 + 1;
    iVar3 = iVar3 - iVar2;
  }
  else {
    __src = puVar4 + iVar3;
    puVar4 = puVar4 + (long)iVar3 + 1;
    iVar3 = iVar2 - iVar3;
  }
  memmove(puVar4,__src,(long)iVar3 * 2);
  (p->super_Permutazione).individuo[c->y] = uVar1;
  return;
}

Assistant:

void PermutazioneI::inserisci(PermutazioneI* p, Coppia& c) {

	unsigned short tmp = p->individuo[c.x];

	if (c.x < c.y) {
		memmove(&p->individuo[c.x], &p->individuo[c.x+1], sizeof(unsigned short) * (c.y - c.x));
	}
	else {
		memmove(&p->individuo[c.y+1], &p->individuo[c.y], sizeof(unsigned short) * (c.x - c.y));
	}

	p->individuo[c.y] = tmp;
}